

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferReader.hh
# Opt level: O0

ssize_t __thiscall avro::BufferReader::read(BufferReader *this,int __fd,void *__buf,size_t __nbytes)

{
  size_t __n;
  BufferReader *this_00;
  unsigned_long *puVar1;
  data_type *__src;
  undefined4 in_register_00000034;
  size_type toRead;
  size_type sizeToRead;
  BufferReader *in_stack_ffffffffffffffc0;
  void *local_20;
  void *local_18;
  BufferReader *local_10;
  BufferReader *local_8;
  
  local_10 = (BufferReader *)CONCAT44(in_register_00000034,__fd);
  local_18 = __buf;
  if ((void *)this->bytesRemaining_ < __buf) {
    local_18 = (void *)this->bytesRemaining_;
  }
  local_20 = local_18;
  local_8 = this;
  while (local_20 != (void *)0x0) {
    this_00 = (BufferReader *)chunkRemaining(in_stack_ffffffffffffffc0);
    puVar1 = std::min<unsigned_long>
                       ((unsigned_long *)&local_20,(unsigned_long *)&stack0xffffffffffffffd0);
    __n = *puVar1;
    in_stack_ffffffffffffffc0 = local_10;
    __src = addr(local_10);
    memcpy(in_stack_ffffffffffffffc0,__src,__n);
    local_20 = (void *)((long)local_20 - __n);
    local_10 = (BufferReader *)((long)&(local_10->bufferImpl_).px + __n);
    incrementChunk(this_00,(size_type)this);
  }
  return (ssize_t)local_18;
}

Assistant:

size_type read(data_type *data, size_type size) { 

        if(size > bytesRemaining_) {
            size = bytesRemaining_;
        }
        size_type sizeToRead = size;

        while(sizeToRead) {
            const size_type toRead = std::min(sizeToRead, chunkRemaining());
            memcpy(data, addr(), toRead);
            sizeToRead -= toRead;
            data += toRead;
            incrementChunk(toRead);
        }

        return size;
    }